

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifrnd(bifcxdef *ctx,int argc)

{
  runsdef *val_00;
  long lVar1;
  runcxdef *ctx_00;
  long in_RDI;
  long test;
  long hi;
  long lo;
  runsdef val;
  int tmp;
  unsigned_long randseed;
  unsigned_long max;
  unsigned_long result;
  int in_stack_ffffffffffffff9c;
  runcxdef *in_stack_ffffffffffffffa0;
  long in_stack_ffffffffffffffa8;
  runcxdef *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  val_00 = *(runsdef **)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  if (val_00 == (runsdef *)0x0) {
    runpnum(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else if (*(int *)(in_RDI + 0x2c) == 0) {
    *(ulong *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) * 0x409 + 5U & 0x3fff;
    runpush(in_stack_ffffffffffffffb0,(dattyp)((ulong)in_stack_ffffffffffffffa8 >> 0x20),val_00);
  }
  else {
    ctx_00 = (runcxdef *)(*(ulong *)(in_RDI + 0x18) % 0x1f31d);
    lVar1 = (*(ulong *)(in_RDI + 0x18) / 0x1f31d) * 0x41a7 + (long)ctx_00 * -0xb14;
    *(long *)(in_RDI + 0x18) = lVar1;
    if (lVar1 < 1) {
      *(long *)(in_RDI + 0x18) = lVar1 + 0x7fffffff;
    }
    else {
      *(long *)(in_RDI + 0x18) = lVar1;
    }
    runpnum(ctx_00,lVar1);
  }
  return;
}

Assistant:

void bifrnd(bifcxdef *ctx, int argc)
{
    unsigned long result, max, randseed;
    int      tmp;
    runsdef  val;

    /* get argument - number giving upper bound of generated number */
    bifcntargs(ctx, 1, argc);
    bifchkarg(ctx, DAT_NUMBER);
    max = runpopnum(ctx->bifcxrun);

    /* if the max is zero, just return zero */
    if (max == 0)
    {
        runpnum(ctx->bifcxrun, 0);
        return;
    }

    /*
     *   If the random number generator has been seeded by a call to
     *   randomize(), use the new, improved random number generator.  If
     *   not, use the old random number generator to ensure that the same
     *   sequence of numbers is generated as always (to prevent breaking
     *   existing test scripts based on the old sequence). 
     */
    if (!ctx->bifcxrndset)
    {
        /* compute the next number in sequence, using old cheesy generator */
        randseed = ctx->bifcxrnd;
        randseed *= 1033;
        randseed += 5;
        tmp = randseed / 16384;
        randseed %= 16384;
        result = tmp / 7;

        /* adjust the result to be in the requested range */
        result = ( randseed % max ) + 1;
        
        /* save the new seed value, and return the value */
        ctx->bifcxrnd = randseed;
        val.runsv.runsvnum = result;
        runpush(ctx->bifcxrun, DAT_NUMBER, &val);
    }
    else
    {
#define BIF_RAND_M  ((ulong)2147483647)
#define BIF_RAND_Q  ((ulong)127773)
#define BIF_RAND_A  ((ulong)16807)
#define BIF_RAND_R  ((ulong)2836)

        long lo, hi, test;

        lo = ctx->bifcxrnd / BIF_RAND_Q;
        hi = ctx->bifcxrnd % BIF_RAND_Q;
        test = BIF_RAND_A*lo - BIF_RAND_R*hi;
        ctx->bifcxrnd = test;
        if (test > 0)
            ctx->bifcxrnd = test;
        else
            ctx->bifcxrnd = test + BIF_RAND_M;
        runpnum(ctx->bifcxrun, (((ulong)ctx->bifcxrnd) % max) + 1);
    }
}